

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<FName,_FName>::Reserve(TArray<FName,_FName> *this,uint amount)

{
  uint uVar1;
  FName *pFVar2;
  uint i;
  ulong uVar3;
  
  Grow(this,amount);
  uVar1 = this->Count;
  this->Count = amount + uVar1;
  pFVar2 = this->Array;
  for (uVar3 = (ulong)uVar1; uVar3 < amount + uVar1; uVar3 = uVar3 + 1) {
    pFVar2[uVar3].Index = 0;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}